

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O2

void ex_Avg(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_symbol *s;
  int iVar1;
  _garray *x;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  float fVar7;
  int size;
  t_word *wvec;
  int local_24;
  t_word *local_20;
  
  if (argv->ex_type == 7) {
    s = (t_symbol *)(argv->ex_cont).v_vec;
    if (s == (t_symbol *)0x0) {
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar5 = "(null)";
    }
    else {
      x = (_garray *)pd_findbyclass(s,garray_class);
      if ((x != (_garray *)0x0) && (iVar1 = garray_getfloatwords(x,&local_24,&local_20), iVar1 != 0)
         ) {
        if (argv[1].ex_type == 2) {
          lVar6 = (long)argv[1].ex_cont.v_flt;
LAB_0019701f:
          lVar2 = 0;
          if (0 < lVar6) {
            lVar2 = lVar6;
          }
          if (argv[2].ex_type == 2) {
            lVar6 = (long)argv[2].ex_cont.v_flt;
LAB_00197050:
            lVar4 = (long)local_24;
            lVar3 = lVar4 + -1;
            if (lVar6 < lVar4) {
              lVar3 = lVar6;
            }
            fVar7 = 0.0;
            for (lVar6 = lVar2; lVar6 <= lVar3; lVar6 = lVar6 + 1) {
              if (lVar6 < lVar4) {
                fVar7 = fVar7 + local_20[lVar6].w_float;
              }
            }
            optr->ex_type = 2;
            (optr->ex_cont).v_flt = fVar7 / (float)((lVar3 - lVar2) + 1);
            return;
          }
          if (argv[2].ex_type == 1) {
            lVar6 = argv[2].ex_cont.v_int;
            goto LAB_00197050;
          }
        }
        else if (argv[1].ex_type == 1) {
          lVar6 = argv[1].ex_cont.v_int;
          goto LAB_0019701f;
        }
        pcVar5 = "expr: Avg: boundaries have to be fix values\n";
        goto LAB_00196fc6;
      }
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar5 = s->s_name;
    }
    pd_error((void *)0x0,"no such table \'%s\'",pcVar5);
  }
  else {
    pcVar5 = "expr: sum: need a table name\n";
LAB_00196fc6:
    post(pcVar5);
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
  }
  return;
}

Assistant:

void
ex_Avg(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        t_symbol *s;
        t_garray *garray;
        int size;
        t_word *wvec;
        t_float sum;
        long indx, n1, n2;

        if (argv->ex_type != ET_SYM)
        {
                post("expr: sum: need a table name\n");
                optr->ex_type = ET_INT;
                optr->ex_int = 0;
                return;
        }

        s = (fts_symbol_t ) argv->ex_ptr;

        ISTABLE(s, garray, size, wvec);

                switch((++argv)->ex_type) {
                case ET_INT:
                n1 = argv->ex_int;
                        break;
                case ET_FLT:
                n1 = argv->ex_flt;
                        break;
                default:
                        post("expr: Avg: boundaries have to be fix values\n");
                        optr->ex_type = ET_INT;
                        optr->ex_int = 0;
                        return;
                }
                if (n1 < 0)
                        n1 = 0;

                switch((++argv)->ex_type) {
                case ET_INT:
                n2 = argv->ex_int;
                        break;
                case ET_FLT:
                n2 = argv->ex_flt;
                        break;
                default:
                        post("expr: Avg: boundaries have to be fix values\n");
                        optr->ex_type = ET_INT;
                        optr->ex_int = 0;
                        return;
                }
                if (n2 >= size)
                        n2 = size - 1;

        for (indx = n1, sum = 0; indx <= n2; indx++)
                if (indx >= 0 && indx < size)
                        sum += wvec[indx].w_float;

        optr->ex_type = ET_FLT;
        optr->ex_flt = sum / (n2 - n1 + 1);
}